

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

int32_t intersect_vector16_inplace(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  bool bVar6;
  __m128i p;
  __m128i sm16;
  int r;
  __m128i res_v;
  size_t tmp_count;
  __m128i tmp [2];
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  int vectorlength;
  size_t i_b;
  size_t i_a;
  size_t count;
  longlong *local_2c8;
  ulong local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int local_278;
  undefined8 local_258;
  longlong lStack_250;
  int local_228;
  ulong local_210;
  longlong local_208 [4];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  ulong local_1c8;
  ulong local_1c0;
  undefined4 local_1b4;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  ulong local_198;
  undefined1 (*local_190) [16];
  ulong local_188;
  undefined1 (*local_180) [16];
  undefined1 (*local_178) [16];
  undefined1 (*local_170) [16];
  undefined1 (*local_168) [16];
  undefined1 (*local_160) [16];
  undefined1 (*local_148) [16];
  undefined1 (*local_140) [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  longlong lStack_f0;
  longlong *local_e0;
  longlong local_d8;
  longlong lStack_d0;
  longlong *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  longlong lStack_90;
  longlong *local_80;
  longlong local_78;
  longlong lStack_70;
  uint16_t b;
  uint16_t a;
  size_t i;
  uint16_t b_max_1;
  undefined8 uStack_58;
  uint16_t a_max_1;
  __m128i p_1;
  __m128i sm16_1;
  longlong lStack_30;
  int r_1;
  __m128i res_v_1;
  longlong lStack_10;
  uint16_t b_max;
  uint16_t a_max;
  
  local_1a0 = 0;
  local_1a8 = 0;
  local_1b0 = 0;
  local_1b4 = 8;
  local_1c0 = in_RSI & 0xfffffffffffffff8;
  local_1c8 = in_RCX & 0xfffffffffffffff8;
  local_180 = in_RDI;
  local_188 = in_RSI;
  local_190 = in_RDX;
  local_198 = in_RCX;
  if (((in_RSI & 0xfffffffffffffff8) != 0) && ((in_RCX & 0xfffffffffffffff8) != 0)) {
    local_1d8 = vlddqu_avx(*in_RDI);
    local_1e8 = vlddqu_avx(*in_RDX);
    lStack_10 = SUB168(ZEXT816(0),4);
    local_208[0] = 0;
    local_208[1] = lStack_10;
    local_2c8 = local_208 + 2;
    do {
      *local_2c8 = 0;
      local_2c8[1] = 0;
      local_2c8 = local_2c8 + 2;
    } while (local_2c8 != (longlong *)local_1e8);
    local_210 = 0;
LAB_00115342:
    bVar6 = true;
    if (*(short *)(*local_180 + local_1a8 * 2) != 0) {
      bVar6 = *(short *)(*local_190 + local_1b0 * 2) == 0;
    }
    if (!bVar6) goto LAB_00115639;
    vpcmpestrm_avx(local_1e8,local_1d8,1);
    local_228 = local_1e8._0_4_;
    local_140 = (undefined1 (*) [16])(shuffle_mask16 + (long)local_228 * 0x10);
    local_108 = local_1d8._0_8_;
    uStack_100 = local_1d8._8_8_;
    local_118 = *(undefined8 *)*local_140;
    uStack_110 = *(undefined8 *)(shuffle_mask16 + (long)local_228 * 0x10 + 8);
    auVar3 = vpshufb_avx(local_1d8,*local_140);
    p_1[1] = (long)local_208 + local_210 * 2;
    local_258 = auVar3._0_8_;
    lStack_250 = auVar3._8_8_;
    uStack_58 = local_258;
    p_1[0] = lStack_250;
    *(undefined8 *)p_1[1] = local_258;
    *(longlong *)((long)local_208 + local_210 * 2 + 8) = lStack_250;
    uVar5 = local_1a8;
    uVar4 = local_1b0;
    local_210 = (long)POPCOUNT(local_228) + local_210;
    uVar1 = *(ushort *)(*local_180 + local_1a8 * 2 + 0xe);
    uVar2 = *(ushort *)(*local_190 + local_1b0 * 2 + 0xe);
    if (uVar1 <= uVar2) {
      i = (size_t)(*local_180 + local_1a0 * 2);
      local_78 = local_208[0];
      lStack_70 = local_208[1];
      *(longlong *)i = local_208[0];
      *(longlong *)(i + 8) = local_208[1];
      res_v_1[0] = SUB168(ZEXT816(0),4);
      local_80 = local_208;
      local_98 = 0;
      lStack_90 = res_v_1[0];
      local_208[0] = 0;
      local_208[1] = res_v_1[0];
      local_1a0 = local_210 + local_1a0;
      local_210 = 0;
      local_1a8 = local_1a8 + 8;
      if (local_1a8 == local_1c0) goto LAB_00115639;
      local_160 = (undefined1 (*) [16])(local_180[1] + uVar5 * 2);
      local_1d8 = vlddqu_avx(*(undefined1 (*) [16])(local_180[1] + uVar5 * 2));
    }
    if (uVar2 <= uVar1) {
      local_1b0 = local_1b0 + 8;
      if (local_1b0 == local_1c8) goto LAB_00115639;
      local_168 = (undefined1 (*) [16])(local_190[1] + uVar4 * 2);
      local_1e8 = vlddqu_avx(*(undefined1 (*) [16])(local_190[1] + uVar4 * 2));
    }
    goto LAB_00115342;
  }
  goto LAB_0011597f;
LAB_00115639:
  if ((local_1a8 < local_1c0) && (local_1b0 < local_1c8)) {
LAB_00115667:
    vpcmpistrm_avx(local_1e8,local_1d8,1);
    local_278 = local_1e8._0_4_;
    local_148 = (undefined1 (*) [16])(shuffle_mask16 + (long)local_278 * 0x10);
    local_128 = local_1d8._0_8_;
    uStack_120 = local_1d8._8_8_;
    local_138 = *(undefined8 *)*local_148;
    uStack_130 = *(undefined8 *)(shuffle_mask16 + (long)local_278 * 0x10 + 8);
    auVar3 = vpshufb_avx(local_1d8,*local_148);
    local_a0 = (undefined8 *)((long)local_208 + local_210 * 2);
    local_2a8 = auVar3._0_8_;
    uStack_2a0 = auVar3._8_8_;
    local_b8 = local_2a8;
    uStack_b0 = uStack_2a0;
    *local_a0 = local_2a8;
    *(undefined8 *)((long)local_208 + local_210 * 2 + 8) = uStack_2a0;
    uVar5 = local_1a8;
    uVar4 = local_1b0;
    local_210 = (long)POPCOUNT(local_278) + local_210;
    uVar1 = *(ushort *)(*local_180 + local_1a8 * 2 + 0xe);
    uVar2 = *(ushort *)(*local_190 + local_1b0 * 2 + 0xe);
    if (uVar1 <= uVar2) {
      local_c0 = (longlong *)(*local_180 + local_1a0 * 2);
      local_d8 = local_208[0];
      lStack_d0 = local_208[1];
      *local_c0 = local_208[0];
      local_c0[1] = local_208[1];
      lStack_30 = SUB168(ZEXT816(0),4);
      local_e0 = local_208;
      local_f8 = 0;
      lStack_f0 = lStack_30;
      local_208[0] = 0;
      local_208[1] = lStack_30;
      local_1a0 = local_210 + local_1a0;
      local_210 = 0;
      local_1a8 = local_1a8 + 8;
      if (local_1a8 == local_1c0) goto LAB_00115911;
      local_170 = (undefined1 (*) [16])(local_180[1] + uVar5 * 2);
      local_1d8 = vlddqu_avx(*(undefined1 (*) [16])(local_180[1] + uVar5 * 2));
    }
    if (uVar2 <= uVar1) {
      local_1b0 = local_1b0 + 8;
      if (local_1b0 == local_1c8) goto LAB_00115911;
      local_178 = (undefined1 (*) [16])(local_190[1] + uVar4 * 2);
      local_1e8 = vlddqu_avx(*(undefined1 (*) [16])(local_190[1] + uVar4 * 2));
    }
    goto LAB_00115667;
  }
LAB_00115911:
  for (local_2b8 = 0; local_2b8 < local_210; local_2b8 = local_2b8 + 1) {
    *(undefined2 *)(*local_180 + local_1a0 * 2) = *(undefined2 *)((long)local_208 + local_2b8 * 2);
    local_1a0 = local_1a0 + 1;
  }
  local_1a8 = local_210 + local_1a8;
LAB_0011597f:
  while (local_1a8 < local_188 && local_1b0 < local_198) {
    uVar1 = *(ushort *)(*local_180 + local_1a8 * 2);
    if (uVar1 < *(ushort *)(*local_190 + local_1b0 * 2)) {
      local_1a8 = local_1a8 + 1;
    }
    else {
      if (uVar1 <= *(ushort *)(*local_190 + local_1b0 * 2)) {
        *(ushort *)(*local_180 + local_1a0 * 2) = uVar1;
        local_1a0 = local_1a0 + 1;
        local_1a8 = local_1a8 + 1;
      }
      local_1b0 = local_1b0 + 1;
    }
  }
  return (int32_t)local_1a0;
}

Assistant:

int32_t intersect_vector16_inplace(uint16_t *__restrict__ A, size_t s_a,
                                   const uint16_t *__restrict__ B, size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        __m128i tmp[2] = {_mm_setzero_si128()};
        size_t tmp_count = 0;
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
            tmp_count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                _mm_storeu_si128(tmp, _mm_setzero_si128());
                count += tmp_count;
                tmp_count = 0;
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b)) {
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
                tmp_count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                    _mm_storeu_si128(tmp, _mm_setzero_si128());
                    count += tmp_count;
                    tmp_count = 0;
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
        }
        // tmp_count <= 8, so this does not affect efficiency so much
        for (size_t i = 0; i < tmp_count; i++) {
            A[count] = ((uint16_t *)tmp)[i];
            count++;
        }
        i_a += tmp_count;  // We can at least jump pass $tmp_count elements in A
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            A[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}